

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O3

EffectStateFactory * getFactoryByType(ALenum type)

{
  EffectStateFactory *pEVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 5;
  lVar2 = 0;
  do {
    if (*(int *)((long)&(anonymous_namespace)::FactoryList + lVar2) == type) {
LAB_0011db3a:
      pEVar1 = (EffectStateFactory *)(**(code **)(&UNK_001ace68 + lVar2))();
      return pEVar1;
    }
    if (*(int *)((long)&DAT_001ace70 + lVar2) == type) {
      if (lVar2 == 0x100) {
        return (EffectStateFactory *)0x0;
      }
      pEVar1 = (EffectStateFactory *)(**(code **)(&UNK_001ace78 + lVar2))();
      return pEVar1;
    }
    if (*(int *)((long)&DAT_001ace80 + lVar2) == type) {
      lVar2 = lVar2 + 0x20;
      goto LAB_0011db3a;
    }
    if (*(int *)((long)&DAT_001ace90 + lVar2) == type) {
      lVar2 = lVar2 + 0x30;
      goto LAB_0011db3a;
    }
    lVar2 = lVar2 + 0x40;
    uVar3 = uVar3 - 1;
    if (uVar3 < 2) {
      if (type != 0xa000) {
        return (EffectStateFactory *)0x0;
      }
      pEVar1 = ConvolutionStateFactory_getFactory();
      return pEVar1;
    }
  } while( true );
}

Assistant:

EffectStateFactory *getFactoryByType(ALenum type)
{
    auto iter = std::find_if(std::begin(FactoryList), std::end(FactoryList),
        [type](const FactoryItem &item) noexcept -> bool
        { return item.Type == type; }
    );
    return (iter != std::end(FactoryList)) ? iter->GetFactory() : nullptr;
}